

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_expect_str_match(mpack_reader_t *reader,char *str,size_t len)

{
  _Bool _Var1;
  uint32_t uVar2;
  byte *pbVar3;
  uint uVar4;
  size_t sVar5;
  
  if ((len >> 0x20 != 0) && (reader->error == mpack_ok)) {
    reader->error = mpack_error_type;
    reader->end = reader->data;
    if (reader->error_fn != (mpack_reader_error_t)0x0) {
      (*reader->error_fn)(reader,mpack_error_type);
    }
  }
  uVar2 = mpack_expect_str(reader);
  if ((uVar2 != (uint32_t)len) && (reader->error == mpack_ok)) {
    reader->error = mpack_error_type;
    reader->end = reader->data;
    if (reader->error_fn != (mpack_reader_error_t)0x0) {
      (*reader->error_fn)(reader,mpack_error_type);
    }
  }
  if (len != 0 && reader->error == mpack_ok) {
    sVar5 = 0;
    do {
      uVar4 = 0;
      if (reader->error == mpack_ok) {
        pbVar3 = (byte *)reader->data;
        if ((byte *)reader->end == pbVar3) {
          _Var1 = mpack_reader_ensure_straddle(reader,1);
          uVar4 = 0;
          if (!_Var1) goto LAB_00104ec9;
          pbVar3 = (byte *)reader->data;
        }
        uVar4 = (uint)*pbVar3;
        reader->data = (char *)(pbVar3 + 1);
      }
LAB_00104ec9:
      if (uVar4 != (int)str[sVar5]) {
        if (reader->error != mpack_ok) {
          return;
        }
        reader->error = mpack_error_type;
        reader->end = reader->data;
        if (reader->error_fn == (mpack_reader_error_t)0x0) {
          return;
        }
        (*reader->error_fn)(reader,mpack_error_type);
        return;
      }
      sVar5 = sVar5 + 1;
    } while (len != sVar5);
  }
  return;
}

Assistant:

void mpack_expect_str_match(mpack_reader_t* reader, const char* str, size_t len) {
    mpack_assert(str != NULL, "str cannot be NULL");

    // expect a str the correct length
    if (len > UINT32_MAX)
        mpack_reader_flag_error(reader, mpack_error_type);
    mpack_expect_str_length(reader, (uint32_t)len);
    if (mpack_reader_error(reader))
        return;
    mpack_reader_track_bytes(reader, len);

    // check each byte one by one (matched strings are likely to be very small)
    for (; len > 0; --len) {
        if (mpack_expect_native_u8(reader) != *str++) {
            mpack_reader_flag_error(reader, mpack_error_type);
            return;
        }
    }

    mpack_done_str(reader);
}